

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O3

decNumber *
uprv_decNumberNextToward_63(decNumber *res,decNumber *lhs,decNumber *rhs,decContext *set)

{
  byte bVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint8_t negate;
  int32_t iVar5;
  rounding rVar6;
  uint32_t status;
  decContext workset;
  uint32_t local_5c;
  decContext local_58;
  decNumber local_34;
  
  local_58.digits = set->digits;
  local_58.emax = set->emax;
  uVar2 = set->emin;
  uVar3 = set->round;
  uVar4 = set->traps;
  local_58.status = set->status;
  local_58.clamp = set->clamp;
  local_58._25_3_ = *(undefined3 *)&set->field_0x19;
  local_5c = 0;
  local_58.emin = uVar2;
  local_58.round = uVar3;
  local_58.traps = uVar4;
  if (((lhs->bits & 0x30) == 0) && ((rhs->bits & 0x30) == 0)) {
    iVar5 = decCompare(lhs,rhs,'\0');
    if (iVar5 == 0) {
      bVar1 = rhs->bits;
      uprv_decNumberCopy_63(res,lhs);
      res->bits = res->bits & 0x7f | bVar1 & 0x80;
    }
    else {
      if (iVar5 < 0) {
        rVar6 = DEC_ROUND_CEILING;
        negate = '\0';
        if (0xbf < lhs->bits) {
          decSetMaxValue(res,set);
          res->bits = 0x80;
          return res;
        }
      }
      else {
        if ((lhs->bits & 0xc0) == 0x40) {
          decSetMaxValue(res,set);
          return res;
        }
        negate = 0x80;
        rVar6 = DEC_ROUND_FLOOR;
      }
      local_34.bits = '\0';
      local_34.lsu[0] = '\x01';
      local_34.digits = 1;
      local_34.exponent = -1000000000;
      local_58.round = rVar6;
      decAddOp(res,lhs,&local_34,&local_58,negate,&local_5c);
      if (((res->bits & 0x70) == 0) && (res->lsu[0] != '\0' || res->digits != 1)) {
        if (local_5c == 0 || set->emin < res->digits + res->exponent) {
          return res;
        }
        goto LAB_002491d1;
      }
    }
  }
  else {
    decNaNs(res,lhs,rhs,set,&local_5c);
  }
  if (local_5c == 0) {
    return res;
  }
LAB_002491d1:
  decStatus(res,local_5c,set);
  return res;
}

Assistant:

U_CAPI decNumber * U_EXPORT2 uprv_decNumberNextToward(decNumber *res, const decNumber *lhs,
                                const decNumber *rhs, decContext *set) {
  decNumber dtiny;                           /* constant  */
  decContext workset=*set;                   /* work  */
  Int result;                                /* ..  */
  uInt status=0;                             /* accumulator  */
  #if DECCHECK
  if (decCheckOperands(res, lhs, rhs, set)) return res;
  #endif

  if (decNumberIsNaN(lhs) || decNumberIsNaN(rhs)) {
    decNaNs(res, lhs, rhs, set, &status);
    }
   else { /* Is numeric, so no chance of sNaN Invalid, etc.  */
    result=decCompare(lhs, rhs, 0);     /* sign matters  */
    if (result==BADINT) status|=DEC_Insufficient_storage; /* rare  */
     else { /* valid compare  */
      if (result==0) uprv_decNumberCopySign(res, lhs, rhs); /* easy  */
       else { /* differ: need NextPlus or NextMinus  */
        uByte sub;                      /* add or subtract  */
        if (result<0) {                 /* lhs<rhs, do nextplus  */
          /* -Infinity is the special case  */
          if ((lhs->bits&(DECINF|DECNEG))==(DECINF|DECNEG)) {
            decSetMaxValue(res, set);
            res->bits=DECNEG;           /* negative  */
            return res;                 /* there is no status to set  */
            }
          workset.round=DEC_ROUND_CEILING;
          sub=0;                        /* add, please  */
          } /* plus  */
         else {                         /* lhs>rhs, do nextminus  */
          /* +Infinity is the special case  */
          if ((lhs->bits&(DECINF|DECNEG))==DECINF) {
            decSetMaxValue(res, set);
            return res;                 /* there is no status to set  */
            }
          workset.round=DEC_ROUND_FLOOR;
          sub=DECNEG;                   /* subtract, please  */
          } /* minus  */
        uprv_decNumberZero(&dtiny);          /* start with 0  */
        dtiny.lsu[0]=1;                 /* make number that is ..  */
        dtiny.exponent=DEC_MIN_EMIN-1;  /* .. smaller than tiniest  */
        decAddOp(res, lhs, &dtiny, &workset, sub, &status); /* + or -  */
        /* turn off exceptions if the result is a normal number  */
        /* (including Nmin), otherwise let all status through  */
        if (uprv_decNumberIsNormal(res, set)) status=0;
        } /* unequal  */
      } /* compare OK  */
    } /* numeric  */
  if (status!=0) decStatus(res, status, set);
  return res;
  }